

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

bool __thiscall
QListModeViewBase::dropOn
          (QListModeViewBase *this,QDropEvent *event,int *dropRow,int *dropCol,
          QModelIndex *dropIndex)

{
  QWidgetData *pQVar1;
  QListViewPrivate *this_00;
  QListView *pQVar2;
  undefined1 auVar3 [12];
  QRect QVar4;
  QRect QVar5;
  QRect QVar6;
  QRect QVar7;
  undefined4 uVar8;
  char cVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  LayoutDirection LVar14;
  uint uVar15;
  DropIndicatorPosition DVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 local_98 [16];
  QPoint local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [8];
  QPoint QStack_60;
  QPoint local_58;
  undefined1 local_48 [8];
  QPoint QStack_40;
  long local_38;
  
  QVar7._8_8_ = QStack_60;
  QVar7._0_8_ = local_68;
  QVar5._8_8_ = local_98._8_8_;
  QVar5._0_8_ = local_98._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event[0xc] == (QDropEvent)0x0) {
    local_68._0_4_ = -1;
    local_68._4_4_ = -1;
    QStack_60.xp.m_i = 0;
    QStack_60.yp.m_i = 0;
    local_58.xp.m_i = 0;
    local_58.yp.m_i = 0;
    pQVar1 = ((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
              super_QAbstractScrollAreaPrivate.viewport)->data;
    iVar18 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    local_98._8_8_ = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,iVar18);
    local_98._0_4_ = 0;
    local_98._4_4_ = 0;
    auVar21._0_8_ =
         (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(event + 0x10);
    auVar21._8_8_ =
         (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(event + 0x18);
    auVar21 = minpd(_DAT_0066f5d0,auVar21);
    auVar22._8_8_ = -(ulong)(-2147483648.0 < auVar21._8_8_);
    auVar22._0_8_ = -(ulong)(-2147483648.0 < auVar21._0_8_);
    uVar17 = (ulong)(uint)(int)auVar21._0_8_;
    uVar19 = movmskpd(iVar18,auVar22);
    uVar20 = (ulong)(uint)(int)auVar21._8_8_ << 0x20;
    if ((uVar19 & 2) == 0) {
      uVar20 = 0x8000000000000000;
    }
    if ((uVar19 & 1) == 0) {
      uVar17 = 0x80000000;
    }
    local_48 = (undefined1  [8])(uVar17 | uVar20);
    cVar9 = QRect::contains((QPoint *)local_98,SUB81(local_48,0));
    if (cVar9 != '\0') {
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      auVar23._0_8_ =
           (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x10);
      auVar23._8_8_ =
           (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x18);
      auVar21 = minpd(_DAT_0066f5d0,auVar23);
      auVar21 = maxpd(auVar21,_DAT_0066f5e0);
      iVar12 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xd])(this);
      iVar13 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xe])(this);
      iVar12 = iVar12 + (int)auVar21._0_8_;
      iVar13 = iVar13 + (int)auVar21._8_8_;
      auVar24._4_4_ = iVar13;
      auVar24._0_4_ = iVar12;
      auVar24._8_4_ = iVar12;
      auVar24._12_4_ = iVar13;
      this_00 = (this->super_QCommonListViewBase).dd;
      iVar18 = this_00->space;
      local_78._4_4_ = iVar13 - iVar18;
      local_78._0_4_ = iVar12 - iVar18;
      auVar3._4_8_ = auVar24._8_8_;
      auVar3._0_4_ = iVar13 + iVar18;
      auVar25._0_8_ = auVar3._0_8_ << 0x20;
      auVar25._8_4_ = iVar12 + iVar18;
      auVar25._12_4_ = iVar13 + iVar18;
      puStack_70 = (undefined1 *)auVar25._8_8_;
      local_88 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      QStack_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      LVar14 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      _local_48 = QRect::normalized();
      uVar17 = local_48;
      if (LVar14 == RightToLeft) {
        pQVar1 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar12 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
        iVar18 = (this_00->commonListView->contentsSize).wd.m_i;
        if (iVar12 <= iVar18) {
          iVar12 = iVar18;
        }
        uVar19 = ~local_48._8_4_ + iVar12;
        QStack_40 = (QPoint)((ulong)((local_48._8_4_ - local_48._0_4_) + uVar19) |
                            local_48._8_8_ & 0xffffffff00000000);
        local_48 = (undefined1  [8])((ulong)uVar19 | uVar17 & 0xffffffff00000000);
      }
      (*this_00->commonListView->_vptr_QCommonListViewBase[7])
                (local_98,this_00->commonListView,local_48);
      if (local_88 == (QPoint)0x0) {
        local_48._0_4_ = 0;
        local_48._4_4_ = 0;
        QStack_40.xp.m_i = 0;
        QStack_40.yp.m_i = 0;
        uVar19 = 0xffffffff;
        local_68._4_4_ = -1;
      }
      else {
        uVar19 = *(uint *)(local_98._8_8_ + (long)local_88 * 0x18 + -0x18);
        local_68._4_4_ = *(int *)(local_98._8_8_ + (long)local_88 * 0x18 + -0x14);
        local_48 = *(undefined1 (*) [8])(local_98._8_8_ + (long)local_88 * 0x18 + -0x10);
        QStack_40 = ((QPoint *)(local_98._8_8_ + (long)local_88 * 0x18 + -0x10))[1];
      }
      local_68._0_4_ = uVar19;
      QStack_60.xp.m_i = local_48._0_4_;
      QStack_60.yp.m_i = local_48._4_4_;
      local_58 = QStack_40;
      if ((((int)uVar19 < 0) || ((int)local_68._4_4_ < 0)) || (QStack_40 == (QPoint)0x0)) {
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)local_68,
                   &(((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).root);
      }
      if ((QPoint)local_98._0_8_ != (QPoint)0x0) {
        LOCK();
        *(int *)local_98._0_8_ = *(int *)local_98._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_98._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_98._0_8_,0x18,0x10);
        }
      }
    }
    uVar15 = (**(code **)(*(long *)(((this->super_QCommonListViewBase).dd)->
                                   super_QAbstractItemViewPrivate).model + 0xe8))();
    QVar7.x2.m_i = QStack_60.xp.m_i;
    QVar7.y2.m_i = QStack_60.yp.m_i;
    QVar7.x1.m_i = local_68._0_4_;
    QVar7.y1.m_i = local_68._4_4_;
    QVar5.x2.m_i = local_98._8_4_;
    QVar5.y2.m_i = local_98._12_4_;
    QVar5.x1.m_i = local_98._0_4_;
    QVar5.y1.m_i = local_98._4_4_;
    if ((*(uint *)(event + 0x2c) & uVar15) != 0) {
      cVar9 = comparesEqual(&(((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate
                             ).root,(QModelIndex *)local_68);
      QVar6.x2.m_i = QStack_60.xp.m_i;
      QVar6.y2.m_i = QStack_60.yp.m_i;
      QVar6.x1.m_i = local_68._0_4_;
      QVar6.y1.m_i = local_68._4_4_;
      QVar4.x2.m_i = local_98._8_4_;
      QVar4.y2.m_i = local_98._12_4_;
      QVar4.x1.m_i = local_98._0_4_;
      QVar4.y1.m_i = local_98._4_4_;
      if (cVar9 == '\0') {
        auVar26._0_8_ =
             (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x10);
        auVar26._8_8_ =
             (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x18);
        auVar21 = minpd(_DAT_0066f5d0,auVar26);
        auVar27._8_8_ = -(ulong)(-2147483648.0 < auVar21._8_8_);
        auVar27._0_8_ = -(ulong)(-2147483648.0 < auVar21._0_8_);
        uVar19 = movmskpd(uVar19,auVar27);
        uVar17 = 0x8000000000000000;
        if ((uVar19 & 2) != 0) {
          uVar17 = (ulong)(uint)(int)auVar21._8_8_ << 0x20;
        }
        uVar20 = 0x80000000;
        if ((uVar19 & 1) != 0) {
          uVar20 = (ulong)(uint)(int)auVar21._0_8_;
        }
        local_48 = (undefined1  [8])(uVar20 | uVar17);
        pQVar2 = (this->super_QCommonListViewBase).qq;
        local_98 = (**(code **)(*(long *)&(pQVar2->super_QAbstractItemView).
                                          super_QAbstractScrollArea.super_QFrame.super_QWidget +
                               0x1e0))(pQVar2,(QModelIndex *)local_68);
        DVar16 = position(this,(QPoint *)local_48,(QRect *)local_98,(QModelIndex *)local_68);
        QVar6.x2.m_i = QStack_60.xp.m_i;
        QVar6.y2.m_i = QStack_60.yp.m_i;
        QVar6.x1.m_i = local_68._0_4_;
        QVar6.y1.m_i = local_68._4_4_;
        (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
        dropIndicatorPosition = DVar16;
        iVar18 = local_68._0_4_;
        uVar8 = local_68._4_4_;
        if (DVar16 == BelowItem) {
          if (local_58 == (QPoint)0x0) {
            local_98 = ZEXT816(0xffffffffffffffff);
            local_88.xp.m_i = 0;
            local_88.yp.m_i = 0;
          }
          else {
            (**(code **)(*(long *)local_58 + 0x68))(local_98,local_58,local_68);
          }
          iVar18 = iVar18 + 1;
        }
        else {
          iVar12 = -1;
          iVar13 = -1;
          if (DVar16 != AboveItem) goto LAB_0057add3;
          if (local_58 == (QPoint)0x0) {
            local_98 = ZEXT816(0xffffffffffffffff);
            local_88.xp.m_i = 0;
            local_88.yp.m_i = 0;
          }
          else {
            (**(code **)(*(long *)local_58 + 0x68))(local_98,local_58,local_68);
          }
        }
        local_58 = local_88;
        iVar12 = iVar18;
        iVar13 = uVar8;
        QVar6 = (QRect)local_98;
      }
      else {
        (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
        dropIndicatorPosition = OnViewport;
        iVar12 = -1;
        iVar13 = -1;
        local_98 = (undefined1  [16])QVar4;
      }
LAB_0057add3:
      (dropIndex->m).ptr = (QAbstractItemModel *)local_58;
      *(QRect *)dropIndex = QVar6;
      *dropRow = iVar12;
      *dropCol = iVar13;
      _local_68 = QVar6;
      bVar10 = QAbstractItemViewPrivate::droppingOnItself
                         (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate,
                          event,(QModelIndex *)local_68);
      bVar11 = true;
      QVar5 = (QRect)local_98;
      QVar7 = _local_68;
      if (!bVar10) goto LAB_0057ae13;
    }
  }
  bVar11 = false;
LAB_0057ae13:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar11;
  }
  local_98 = (undefined1  [16])QVar5;
  _local_68 = QVar7;
  __stack_chk_fail();
}

Assistant:

bool QListModeViewBase::dropOn(QDropEvent *event, int *dropRow, int *dropCol, QModelIndex *dropIndex)
{
    if (event->isAccepted())
        return false;

    QModelIndex index;
    if (dd->viewport->rect().contains(event->position().toPoint())) {
        // can't use indexAt, doesn't account for spacing.
        QPoint p = event->position().toPoint();
        QRect rect(p.x() + horizontalOffset(), p.y() + verticalOffset(), 1, 1);
        rect.adjust(-dd->spacing(), -dd->spacing(), dd->spacing(), dd->spacing());
        const QList<QModelIndex> intersectVector = dd->intersectingSet(rect);
        index = intersectVector.size() > 0
            ? intersectVector.last() : QModelIndex();
        if (!index.isValid())
            index = dd->root;
    }

    // If we are allowed to do the drop
    if (dd->model->supportedDropActions() & event->dropAction()) {
        int row = -1;
        int col = -1;
        if (index != dd->root) {
            dd->dropIndicatorPosition = position(event->position().toPoint(), qq->visualRect(index), index);
            switch (dd->dropIndicatorPosition) {
            case QAbstractItemView::AboveItem:
                row = index.row();
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::BelowItem:
                row = index.row() + 1;
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::OnItem:
            case QAbstractItemView::OnViewport:
                break;
            }
        } else {
            dd->dropIndicatorPosition = QAbstractItemView::OnViewport;
        }
        *dropIndex = index;
        *dropRow = row;
        *dropCol = col;
        if (!dd->droppingOnItself(event, index))
            return true;
    }
    return false;
}